

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_levels_utils.c
# Opt level: O0

int QuantizeLevels(uint8_t *data,int width,int height,int num_levels,uint64_t *sse)

{
  bool bVar1;
  int iVar2;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  ulong *in_R8;
  undefined1 auVar3 [16];
  int slot_1;
  size_t n_1;
  int s_1;
  uint8_t map [256];
  double error;
  double count;
  int slot;
  int s;
  double q_count [256];
  double q_sum [256];
  size_t n;
  double err_threshold;
  double err;
  double last_err;
  int iter;
  int num_levels_in;
  int i;
  size_t data_size;
  int max_s;
  int min_s;
  double inv_q_level [256];
  int q_level [256];
  int freq [256];
  ulong local_2198;
  uint local_218c;
  undefined1 auStack_2188 [264];
  double local_2080;
  double local_2078;
  int local_2070;
  uint local_206c;
  double local_2068 [256];
  double local_1868 [256];
  ulong local_1068;
  double local_1060;
  double local_1058;
  double local_1050;
  int local_1044;
  int local_1040;
  int local_103c;
  ulong local_1038;
  uint local_1030;
  uint local_102c;
  double local_1028 [256];
  int local_828 [256];
  int local_428 [256];
  ulong *local_28;
  int local_1c;
  int local_18;
  int local_14;
  long local_10;
  int local_4;
  
  local_28 = in_R8;
  local_1c = in_ECX;
  local_18 = in_EDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  memset(local_428,0,0x400);
  memset(local_828,0,0x400);
  memset(local_1028,0,0x800);
  local_102c = 0xff;
  local_1030 = 0;
  iVar2 = local_18 * local_14;
  local_1038 = (ulong)iVar2;
  local_1050 = 1e+38;
  local_1058 = 0.0;
  auVar3._8_4_ = iVar2 >> 0x1f;
  auVar3._0_8_ = local_1038;
  auVar3._12_4_ = 0x45300000;
  local_1060 = ((auVar3._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,iVar2) - 4503599627370496.0)) * 0.0001;
  if (local_10 == 0) {
    local_4 = 0;
  }
  else if ((local_14 < 1) || (local_18 < 1)) {
    local_4 = 0;
  }
  else if ((local_1c < 2) || (0x100 < local_1c)) {
    local_4 = 0;
  }
  else {
    local_1040 = 0;
    for (local_1068 = 0; local_1068 < local_1038; local_1068 = local_1068 + 1) {
      local_1040 = (uint)(local_428[*(byte *)(local_10 + local_1068)] == 0) + local_1040;
      if (*(byte *)(local_10 + local_1068) < local_102c) {
        local_102c = (uint)*(byte *)(local_10 + local_1068);
      }
      if (local_1030 < *(byte *)(local_10 + local_1068)) {
        local_1030 = (uint)*(byte *)(local_10 + local_1068);
      }
      local_428[*(byte *)(local_10 + local_1068)] = local_428[*(byte *)(local_10 + local_1068)] + 1;
    }
    if (local_1c < local_1040) {
      for (local_103c = 0; local_103c < local_1c; local_103c = local_103c + 1) {
        local_1028[local_103c] =
             (double)local_102c +
             ((double)(int)(local_1030 - local_102c) * (double)local_103c) / (double)(local_1c + -1)
        ;
      }
      local_828[(int)local_102c] = 0;
      local_828[(int)local_1030] = local_1c + -1;
      for (local_1044 = 0; local_1044 < 6; local_1044 = local_1044 + 1) {
        memset(local_1868,0,0x800);
        memset(local_2068,0,0x800);
        local_2070 = 0;
        for (local_206c = local_102c; (int)local_206c <= (int)local_1030;
            local_206c = local_206c + 1) {
          while( true ) {
            bVar1 = false;
            if (local_2070 < local_1c + -1) {
              bVar1 = local_1028[local_2070] + local_1028[local_2070 + 1] <
                      (double)(int)(local_206c << 1);
            }
            if (!bVar1) break;
            local_2070 = local_2070 + 1;
          }
          if (0 < local_428[(int)local_206c]) {
            local_1868[local_2070] =
                 (double)(int)(local_206c * local_428[(int)local_206c]) + local_1868[local_2070];
            local_2068[local_2070] = (double)local_428[(int)local_206c] + local_2068[local_2070];
          }
          local_828[(int)local_206c] = local_2070;
        }
        if (2 < local_1c) {
          for (local_2070 = 1; local_2070 < local_1c + -1; local_2070 = local_2070 + 1) {
            local_2078 = local_2068[local_2070];
            if (0.0 < local_2078) {
              local_1028[local_2070] = local_1868[local_2070] / local_2078;
            }
          }
        }
        local_1058 = 0.0;
        for (local_206c = local_102c; (int)local_206c <= (int)local_1030;
            local_206c = local_206c + 1) {
          local_2080 = (double)(int)local_206c - local_1028[local_828[(int)local_206c]];
          local_1058 = (double)local_428[(int)local_206c] * local_2080 * local_2080 + local_1058;
        }
        if (local_1050 - local_1058 < local_1060) break;
        local_1050 = local_1058;
      }
      for (local_218c = local_102c; (int)local_218c <= (int)local_1030; local_218c = local_218c + 1)
      {
        auStack_2188[(int)local_218c] = (char)(int)(local_1028[local_828[(int)local_218c]] + 0.5);
      }
      for (local_2198 = 0; local_2198 < local_1038; local_2198 = local_2198 + 1) {
        *(undefined1 *)(local_10 + local_2198) = auStack_2188[*(byte *)(local_10 + local_2198)];
      }
    }
    if (local_28 != (ulong *)0x0) {
      *local_28 = (long)local_1058 |
                  (long)(local_1058 - 9.223372036854776e+18) & (long)local_1058 >> 0x3f;
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int QuantizeLevels(uint8_t* const data, int width, int height,
                   int num_levels, uint64_t* const sse) {
  int freq[NUM_SYMBOLS] = { 0 };
  int q_level[NUM_SYMBOLS] = { 0 };
  double inv_q_level[NUM_SYMBOLS] = { 0 };
  int min_s = 255, max_s = 0;
  const size_t data_size = height * width;
  int i, num_levels_in, iter;
  double last_err = 1.e38, err = 0.;
  const double err_threshold = ERROR_THRESHOLD * data_size;

  if (data == NULL) {
    return 0;
  }

  if (width <= 0 || height <= 0) {
    return 0;
  }

  if (num_levels < 2 || num_levels > 256) {
    return 0;
  }

  {
    size_t n;
    num_levels_in = 0;
    for (n = 0; n < data_size; ++n) {
      num_levels_in += (freq[data[n]] == 0);
      if (min_s > data[n]) min_s = data[n];
      if (max_s < data[n]) max_s = data[n];
      ++freq[data[n]];
    }
  }

  if (num_levels_in <= num_levels) goto End;  // nothing to do!

  // Start with uniformly spread centroids.
  for (i = 0; i < num_levels; ++i) {
    inv_q_level[i] = min_s + (double)(max_s - min_s) * i / (num_levels - 1);
  }

  // Fixed values. Won't be changed.
  q_level[min_s] = 0;
  q_level[max_s] = num_levels - 1;
  assert(inv_q_level[0] == min_s);
  assert(inv_q_level[num_levels - 1] == max_s);

  // k-Means iterations.
  for (iter = 0; iter < MAX_ITER; ++iter) {
    double q_sum[NUM_SYMBOLS] = { 0 };
    double q_count[NUM_SYMBOLS] = { 0 };
    int s, slot = 0;

    // Assign classes to representatives.
    for (s = min_s; s <= max_s; ++s) {
      // Keep track of the nearest neighbour 'slot'
      while (slot < num_levels - 1 &&
             2 * s > inv_q_level[slot] + inv_q_level[slot + 1]) {
        ++slot;
      }
      if (freq[s] > 0) {
        q_sum[slot] += s * freq[s];
        q_count[slot] += freq[s];
      }
      q_level[s] = slot;
    }

    // Assign new representatives to classes.
    if (num_levels > 2) {
      for (slot = 1; slot < num_levels - 1; ++slot) {
        const double count = q_count[slot];
        if (count > 0.) {
          inv_q_level[slot] = q_sum[slot] / count;
        }
      }
    }

    // Compute convergence error.
    err = 0.;
    for (s = min_s; s <= max_s; ++s) {
      const double error = s - inv_q_level[q_level[s]];
      err += freq[s] * error * error;
    }

    // Check for convergence: we stop as soon as the error is no
    // longer improving.
    if (last_err - err < err_threshold) break;
    last_err = err;
  }

  // Remap the alpha plane to quantized values.
  {
    // double->int rounding operation can be costly, so we do it
    // once for all before remapping. We also perform the data[] -> slot
    // mapping, while at it (avoid one indirection in the final loop).
    uint8_t map[NUM_SYMBOLS];
    int s;
    size_t n;
    for (s = min_s; s <= max_s; ++s) {
      const int slot = q_level[s];
      map[s] = (uint8_t)(inv_q_level[slot] + .5);
    }
    // Final pass.
    for (n = 0; n < data_size; ++n) {
      data[n] = map[data[n]];
    }
  }
 End:
  // Store sum of squared error if needed.
  if (sse != NULL) *sse = (uint64_t)err;

  return 1;
}